

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trodesnetworkpython.cpp
# Opt level: O0

PyObject *
vecToList<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::convert
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *vec)

{
  object_base *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  PyObject *pPVar2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDI;
  size_t i;
  list *l;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *x;
  list *in_stack_ffffffffffffffe0;
  
  this = (object_base *)operator_new(8);
  boost::python::list::list((list *)0x39d033);
  pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  while( true ) {
    x = pbVar3;
    pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::size(in_RDI);
    if (pbVar1 <= pbVar3) break;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[](in_RDI,(size_type)x);
    boost::python::list::append<std::__cxx11::string>(in_stack_ffffffffffffffe0,x);
    pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&x->field_0x1;
  }
  pPVar2 = boost::python::api::object_base::ptr(this);
  return pPVar2;
}

Assistant:

static PyObject* convert(const std::vector<T>& vec){
        list* l = new list();
        for(size_t i = 0; i < vec.size(); i++){
            l->append(vec[i]);
        }
        return l->ptr();
    }